

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O2

void Eigen::internal::
     dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1,_1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1,_1,_false>_>,_Eigen::internal::assign_op<double,_double>,_0>,_3,_0>
     ::run(generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>,_Eigen::internal::assign_op<double,_double>,_0>
           *kernel)

{
  long start;
  double *pdVar1;
  PointerType pdVar2;
  PointerType pdVar3;
  ulong end;
  double dVar4;
  Index index;
  ulong end_00;
  
  pdVar3 = (kernel->m_dstExpr->
           super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>).
           super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>.
           m_data;
  end = (kernel->m_dstExpr->
        super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>).
        super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>.m_rows.
        m_value;
  end_00 = end;
  if ((((ulong)pdVar3 & 7) == 0) &&
     (end_00 = (ulong)((uint)((ulong)pdVar3 >> 3) & 1), (long)end <= (long)end_00)) {
    end_00 = end;
  }
  start = end_00 + ((long)(end - end_00) / 2) * 2;
  unaligned_dense_assignment_loop<false>::
  run<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>,Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>,Eigen::internal::assign_op<double,double>,0>>
            (kernel,0,end_00);
  for (; (long)end_00 < start; end_00 = end_00 + 2) {
    pdVar1 = (kernel->m_src->
             super_block_evaluator<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>
             ).
             super_mapbase_evaluator<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
             .m_data + end_00;
    dVar4 = pdVar1[1];
    pdVar2 = (kernel->m_dst->
             super_block_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>).
             super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
             .m_data + end_00;
    *pdVar2 = *pdVar1;
    pdVar2[1] = dVar4;
  }
  unaligned_dense_assignment_loop<false>::
  run<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>,Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>,Eigen::internal::assign_op<double,double>,0>>
            (kernel,start,end);
  return;
}

Assistant:

void run(Kernel &kernel)
  {
    const Index size = kernel.size();
    typedef typename Kernel::Scalar Scalar;
    typedef typename Kernel::PacketType PacketType;
    enum {
      requestedAlignment = Kernel::AssignmentTraits::LinearRequiredAlignment,
      packetSize = unpacket_traits<PacketType>::size,
      dstIsAligned = int(Kernel::AssignmentTraits::DstAlignment)>=int(requestedAlignment),
      dstAlignment = packet_traits<Scalar>::AlignedOnScalar ? int(requestedAlignment)
                                                            : int(Kernel::AssignmentTraits::DstAlignment),
      srcAlignment = Kernel::AssignmentTraits::JointAlignment
    };
    const Index alignedStart = dstIsAligned ? 0 : internal::first_aligned<requestedAlignment>(kernel.dstDataPtr(), size);
    const Index alignedEnd = alignedStart + ((size-alignedStart)/packetSize)*packetSize;

    unaligned_dense_assignment_loop<dstIsAligned!=0>::run(kernel, 0, alignedStart);

    for(Index index = alignedStart; index < alignedEnd; index += packetSize)
      kernel.template assignPacket<dstAlignment, srcAlignment, PacketType>(index);

    unaligned_dense_assignment_loop<>::run(kernel, alignedEnd, size);
  }